

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O0

int TvCtrlPointCallbackEventHandler(Upnp_EventType EventType,void *Event,void *Cookie)

{
  UpnpClient_Handle UVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  char *varValue;
  IXML_Document *changes;
  char *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  char local_c8 [8];
  Upnp_SID newSID;
  int TimeOut;
  UpnpEventSubscribe *es_event_1;
  UpnpEventSubscribe *es_event;
  UpnpEvent *e_event;
  int errCode_4;
  UpnpStateVarComplete *sv_event;
  int errCode_3;
  UpnpActionComplete *a_event;
  char *deviceId;
  int errCode_2;
  UpnpDiscovery *d_event_1;
  int errCode_1;
  char *location;
  IXML_Document *DescDoc;
  UpnpDiscovery *d_event;
  void *pvStack_20;
  int errCode;
  void *Cookie_local;
  void *Event_local;
  Upnp_EventType EventType_local;
  
  d_event._4_4_ = 0;
  pvStack_20 = Cookie;
  Cookie_local = Event;
  Event_local._4_4_ = EventType;
  SampleUtil_PrintEvent(EventType,Event);
  pvVar2 = Cookie_local;
  UVar1 = ctrlpt_handle;
  switch(Event_local._4_4_) {
  case UPNP_CONTROL_ACTION_REQUEST:
  case UPNP_CONTROL_GET_VAR_REQUEST:
  case UPNP_EVENT_SUBSCRIPTION_REQUEST:
    break;
  case UPNP_CONTROL_ACTION_COMPLETE:
    uVar3 = UpnpActionComplete_get_ErrCode(Cookie_local);
    if (uVar3 != 0) {
      SampleUtil_Print("Error in  Action Complete Callback -- %d\n",(ulong)uVar3);
    }
    break;
  case UPNP_CONTROL_GET_VAR_COMPLETE:
    uVar3 = UpnpStateVarComplete_get_ErrCode(Cookie_local);
    if (uVar3 == 0) {
      uVar6 = UpnpStateVarComplete_get_CtrlUrl(pvVar2);
      pcVar7 = (char *)UpnpString_get_String(uVar6);
      uVar6 = UpnpStateVarComplete_get_StateVarName(pvVar2);
      pcVar5 = (char *)UpnpString_get_String(uVar6);
      varValue = (char *)UpnpStateVarComplete_get_CurrentVal(pvVar2);
      TvCtrlPointHandleGetVar(pcVar7,pcVar5,varValue);
    }
    else {
      SampleUtil_Print("Error in Get Var Complete Callback -- %d\n",(ulong)uVar3);
    }
    break;
  case UPNP_DISCOVERY_ADVERTISEMENT_ALIVE:
  case UPNP_DISCOVERY_SEARCH_RESULT:
    DescDoc = (IXML_Document *)Cookie_local;
    location = (char *)0x0;
    uVar3 = UpnpDiscovery_get_ErrCode(Cookie_local);
    if (uVar3 != 0) {
      SampleUtil_Print("Error in Discovery Callback -- %d\n",(ulong)uVar3);
    }
    uVar6 = UpnpDiscovery_get_Location(DescDoc);
    pcVar5 = (char *)UpnpString_get_String(uVar6);
    uVar3 = UpnpDownloadXmlDoc(pcVar5,&location);
    pcVar7 = location;
    if (uVar3 == 0) {
      iVar4 = UpnpDiscovery_get_Expires(DescDoc);
      TvCtrlPointAddDevice((IXML_Document *)pcVar7,pcVar5,iVar4);
    }
    else {
      SampleUtil_Print("Error obtaining device description from %s -- error = %d\n",pcVar5,
                       (ulong)uVar3);
    }
    if (location != (char *)0x0) {
      ixmlDocument_free(location);
    }
    TvCtrlPointPrintList();
    break;
  case UPNP_DISCOVERY_ADVERTISEMENT_BYEBYE:
    uVar3 = UpnpDiscovery_get_ErrCode(Cookie_local);
    uVar6 = UpnpDiscovery_get_DeviceID(pvVar2);
    pcVar7 = (char *)UpnpString_get_String(uVar6);
    if (uVar3 != 0) {
      SampleUtil_Print("Error in Discovery ByeBye Callback -- %d\n",(ulong)uVar3);
    }
    SampleUtil_Print("Received ByeBye for Device: %s\n",pcVar7);
    TvCtrlPointRemoveDevice(pcVar7);
    SampleUtil_Print("After byebye:\n");
    TvCtrlPointPrintList();
    break;
  case UPNP_DISCOVERY_SEARCH_TIMEOUT:
    break;
  case UPNP_EVENT_RECEIVED:
    pcVar7 = (char *)UpnpEvent_get_SID_cstr(Cookie_local);
    iVar4 = UpnpEvent_get_EventKey(pvVar2);
    changes = (IXML_Document *)UpnpEvent_get_ChangedVariables(pvVar2);
    TvCtrlPointHandleEvent(pcVar7,iVar4,changes);
    break;
  case UPNP_EVENT_RENEWAL_COMPLETE:
  case UPNP_EVENT_SUBSCRIBE_COMPLETE:
  case UPNP_EVENT_UNSUBSCRIBE_COMPLETE:
    d_event._4_4_ = UpnpEventSubscribe_get_ErrCode(Cookie_local);
    if (d_event._4_4_ == 0) {
      uVar6 = UpnpEventSubscribe_get_PublisherUrl(pvVar2);
      pcVar7 = (char *)UpnpString_get_String(uVar6);
      uVar6 = UpnpEventSubscribe_get_SID(pvVar2);
      pcVar5 = (char *)UpnpString_get_String(uVar6);
      iVar4 = UpnpEventSubscribe_get_TimeOut(pvVar2);
      TvCtrlPointHandleSubscribeUpdate(pcVar7,pcVar5,iVar4);
    }
    else {
      SampleUtil_Print("Error in Event Subscribe Callback -- %d\n",(ulong)d_event._4_4_);
    }
    break;
  case UPNP_EVENT_AUTORENEWAL_FAILED:
  case UPNP_EVENT_SUBSCRIPTION_EXPIRED:
    stack0xffffffffffffff68 = Cookie_local;
    newSID[0x24] = (undefined1)default_timeout;
    newSID[0x25] = default_timeout._1_1_;
    newSID[0x26] = default_timeout._2_1_;
    newSID[0x27] = default_timeout._3_1_;
    uVar6 = UpnpEventSubscribe_get_PublisherUrl(Cookie_local);
    uVar6 = UpnpString_get_String(uVar6);
    d_event._4_4_ = UpnpSubscribe(UVar1,uVar6,newSID + 0x24,local_c8);
    if (d_event._4_4_ == 0) {
      SampleUtil_Print("Subscribed to EventURL with SID=%s\n",local_c8);
      uVar6 = UpnpEventSubscribe_get_PublisherUrl(stack0xffffffffffffff68);
      pcVar7 = (char *)UpnpString_get_String(uVar6);
      TvCtrlPointHandleSubscribeUpdate(pcVar7,local_c8,newSID._36_4_);
    }
    else {
      SampleUtil_Print("Error Subscribing to EventURL -- %d\n",(ulong)d_event._4_4_);
    }
  }
  return 0;
}

Assistant:

int TvCtrlPointCallbackEventHandler(
	Upnp_EventType EventType, const void *Event, void *Cookie)
{
	int errCode = 0;
	(void)Cookie;

	SampleUtil_PrintEvent(EventType, Event);
	switch (EventType) {
	/* SSDP Stuff */
	case UPNP_DISCOVERY_ADVERTISEMENT_ALIVE:
	case UPNP_DISCOVERY_SEARCH_RESULT: {
		const UpnpDiscovery *d_event = (UpnpDiscovery *)Event;
		IXML_Document *DescDoc = NULL;
		const char *location = NULL;
		int errCode = UpnpDiscovery_get_ErrCode(d_event);

		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Discovery Callback -- %d\n", errCode);
		}

		location = UpnpString_get_String(
			UpnpDiscovery_get_Location(d_event));
		errCode = UpnpDownloadXmlDoc(location, &DescDoc);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print("Error obtaining device description "
					 "from %s -- error = %d\n",
				location,
				errCode);
		} else {
			TvCtrlPointAddDevice(DescDoc,
				location,
				UpnpDiscovery_get_Expires(d_event));
		}
		if (DescDoc) {
			ixmlDocument_free(DescDoc);
		}
		TvCtrlPointPrintList();
		break;
	}
	case UPNP_DISCOVERY_SEARCH_TIMEOUT:
		/* Nothing to do here... */
		break;
	case UPNP_DISCOVERY_ADVERTISEMENT_BYEBYE: {
		UpnpDiscovery *d_event = (UpnpDiscovery *)Event;
		int errCode = UpnpDiscovery_get_ErrCode(d_event);
		const char *deviceId = UpnpString_get_String(
			UpnpDiscovery_get_DeviceID(d_event));

		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Discovery ByeBye Callback -- %d\n",
				errCode);
		}
		SampleUtil_Print("Received ByeBye for Device: %s\n", deviceId);
		TvCtrlPointRemoveDevice(deviceId);
		SampleUtil_Print("After byebye:\n");
		TvCtrlPointPrintList();
		break;
	}
	/* SOAP Stuff */
	case UPNP_CONTROL_ACTION_COMPLETE: {
		UpnpActionComplete *a_event = (UpnpActionComplete *)Event;
		int errCode = UpnpActionComplete_get_ErrCode(a_event);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in  Action Complete Callback -- %d\n",
				errCode);
		}
		/* No need for any processing here, just print out results.
		 * Service state table updates are handled by events. */
		break;
	}
	case UPNP_CONTROL_GET_VAR_COMPLETE: {
		UpnpStateVarComplete *sv_event = (UpnpStateVarComplete *)Event;
		int errCode = UpnpStateVarComplete_get_ErrCode(sv_event);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Get Var Complete Callback -- %d\n",
				errCode);
		} else {
			TvCtrlPointHandleGetVar(
				UpnpString_get_String(
					UpnpStateVarComplete_get_CtrlUrl(
						sv_event)),
				UpnpString_get_String(
					UpnpStateVarComplete_get_StateVarName(
						sv_event)),
				UpnpStateVarComplete_get_CurrentVal(sv_event));
		}
		break;
	}
	/* GENA Stuff */
	case UPNP_EVENT_RECEIVED: {
		UpnpEvent *e_event = (UpnpEvent *)Event;
		TvCtrlPointHandleEvent(UpnpEvent_get_SID_cstr(e_event),
			UpnpEvent_get_EventKey(e_event),
			UpnpEvent_get_ChangedVariables(e_event));
		break;
	}
	case UPNP_EVENT_SUBSCRIBE_COMPLETE:
	case UPNP_EVENT_UNSUBSCRIBE_COMPLETE:
	case UPNP_EVENT_RENEWAL_COMPLETE: {
		UpnpEventSubscribe *es_event = (UpnpEventSubscribe *)Event;

		errCode = UpnpEventSubscribe_get_ErrCode(es_event);
		if (errCode != UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Error in Event Subscribe Callback -- %d\n",
				errCode);
		} else {
			TvCtrlPointHandleSubscribeUpdate(
				UpnpString_get_String(
					UpnpEventSubscribe_get_PublisherUrl(
						es_event)),
				UpnpString_get_String(
					UpnpEventSubscribe_get_SID(es_event)),
				UpnpEventSubscribe_get_TimeOut(es_event));
		}
		break;
	}
	case UPNP_EVENT_AUTORENEWAL_FAILED:
	case UPNP_EVENT_SUBSCRIPTION_EXPIRED: {
		UpnpEventSubscribe *es_event = (UpnpEventSubscribe *)Event;
		int TimeOut = default_timeout;
		Upnp_SID newSID;

		errCode = UpnpSubscribe(ctrlpt_handle,
			UpnpString_get_String(
				UpnpEventSubscribe_get_PublisherUrl(es_event)),
			&TimeOut,
			newSID);
		if (errCode == UPNP_E_SUCCESS) {
			SampleUtil_Print(
				"Subscribed to EventURL with SID=%s\n", newSID);
			TvCtrlPointHandleSubscribeUpdate(
				UpnpString_get_String(
					UpnpEventSubscribe_get_PublisherUrl(
						es_event)),
				newSID,
				TimeOut);
		} else {
			SampleUtil_Print(
				"Error Subscribing to EventURL -- %d\n",
				errCode);
		}
		break;
	}
	/* ignore these cases, since this is not a device */
	case UPNP_EVENT_SUBSCRIPTION_REQUEST:
	case UPNP_CONTROL_GET_VAR_REQUEST:
	case UPNP_CONTROL_ACTION_REQUEST:
		break;
	}

	return 0;
}